

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5Array.cpp
# Opt level: O1

JavascriptEnumerator * __thiscall
Js::ES5Array::GetIndexEnumerator(ES5Array *this,EnumeratorFlags flags,ScriptContext *requestContext)

{
  Recycler *alloc;
  ES5ArrayIndexEnumerator *this_00;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  local_50 = (undefined1  [8])&ES5ArrayIndexEnumerator::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_63b7f62;
  data.filename._0_4_ = 0x138;
  alloc = Memory::Recycler::TrackAllocInfo
                    (((((((this->super_JavascriptArray).super_ArrayObject.super_DynamicObject.
                          super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
                      super_JavascriptLibraryBase).scriptContext.ptr)->recycler,
                     (TrackAllocData *)local_50);
  this_00 = (ES5ArrayIndexEnumerator *)new<Memory::Recycler>(0x40,alloc,0x38bbb2);
  ES5ArrayIndexEnumerator::ES5ArrayIndexEnumerator(this_00,this,flags,requestContext);
  return (JavascriptEnumerator *)this_00;
}

Assistant:

JavascriptEnumerator * ES5Array::GetIndexEnumerator(EnumeratorFlags flags, ScriptContext* requestContext)
    {
        // ES5Array does not support compat mode, ignore preferSnapshotSemantics
        return RecyclerNew(GetScriptContext()->GetRecycler(), ES5ArrayIndexEnumerator, this, flags, requestContext);
    }